

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void TTD::RuntimeContextInfo::LoadAndOrderPropertyNames
               (RecyclableObject *obj,
               List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *propertyList)

{
  int iVar1;
  ScriptContext *this;
  Type pPVar2;
  Type pPVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  PropertyRecord *pPVar8;
  Type *ppPVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int index;
  int iVar13;
  ulong uVar14;
  int local_40;
  
  if ((propertyList->
      super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).count
      != 0) {
    TTDAbort_unrecoverable_error("This should be empty.");
  }
  this = (((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
         ptr;
  uVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [10])();
  if (uVar4 != 0) {
    uVar14 = 0;
    do {
      uVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(obj,uVar14 & 0xffff);
      if (uVar5 - 0x10 < 0xffffffef) {
        iVar6 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)uVar5);
        if (iVar6 == 0) {
          TTDAbort_unrecoverable_error("We are assuming this is own property count.");
        }
        pPVar8 = Js::ScriptContext::GetPropertyName(this,uVar5);
        JsUtil::
        List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(propertyList,0);
        iVar6 = (propertyList->
                super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                ).count;
        (propertyList->
        super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
        buffer[iVar6] = pPVar8;
        (propertyList->
        super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
        count = iVar6 + 1;
      }
      uVar5 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar5;
    } while (uVar4 != uVar5);
  }
  iVar6 = (propertyList->
          super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
          count;
  lVar10 = 0;
  do {
    iVar1 = (&DAT_010e1ec0)[lVar10];
    if (iVar1 < iVar6) {
      local_40 = 0;
      index = iVar1;
      do {
        ppPVar9 = JsUtil::
                  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(propertyList,index);
        pPVar2 = *ppPVar9;
        iVar11 = index;
        if (iVar1 <= index) {
          iVar12 = local_40;
          do {
            ppPVar9 = JsUtil::
                      List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(propertyList,iVar12);
            uVar4 = (*ppPVar9)->byteCount >> 1;
            uVar5 = pPVar2->byteCount >> 1;
            if (uVar4 == uVar5) {
              iVar7 = PAL_wcscmp((char16_t *)(*ppPVar9 + 1),(char16_t *)(pPVar2 + 1));
              if (iVar7 < 1) break;
            }
            else if (uVar4 <= uVar5) break;
            iVar13 = iVar11 - iVar1;
            ppPVar9 = JsUtil::
                      List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(propertyList,iVar12);
            pPVar3 = *ppPVar9;
            iVar7 = iVar11 + 1;
            JsUtil::
            List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(propertyList,iVar7);
            (propertyList->
            super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
            buffer[iVar11] = pPVar3;
            iVar11 = (propertyList->
                     super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                     ).count;
            if (iVar7 < iVar11) {
              iVar7 = iVar11;
            }
            (propertyList->
            super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
            count = iVar7;
            iVar12 = iVar12 - iVar1;
            iVar11 = iVar13;
          } while (iVar1 <= iVar13);
        }
        iVar12 = iVar11 + 1;
        JsUtil::
        List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(propertyList,iVar12);
        (propertyList->
        super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
        buffer[iVar11] = pPVar2;
        iVar11 = (propertyList->
                 super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                 ).count;
        if (iVar12 < iVar11) {
          iVar12 = iVar11;
        }
        (propertyList->
        super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
        count = iVar12;
        index = index + 1;
        local_40 = local_40 + 1;
      } while (index != iVar6);
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 6) {
      return;
    }
  } while( true );
}

Assistant:

void RuntimeContextInfo::LoadAndOrderPropertyNames(Js::RecyclableObject* obj, JsUtil::List<const Js::PropertyRecord*, HeapAllocator>& propertyList)
    {
        TTDAssert(propertyList.Count() == 0, "This should be empty.");

        Js::ScriptContext* ctx = obj->GetScriptContext();
        uint32 propcount = (uint32)obj->GetPropertyCount();

        //get all of the properties
        for(uint32 i = 0; i < propcount; ++i)
        {
            Js::PropertyIndex propertyIndex = (Js::PropertyIndex)i;
            Js::PropertyId propertyId = obj->GetPropertyId(propertyIndex);

            if((propertyId != Js::Constants::NoProperty) & (!Js::IsInternalPropertyId(propertyId)))
            {
                TTDAssert(obj->HasOwnProperty(propertyId), "We are assuming this is own property count.");

                propertyList.Add(ctx->GetPropertyName(propertyId));
            }
        }

        //now sort the list so the traversal order is stable
        //Rock a custom shell sort!!!!
        const int32 gaps[6] = { 132, 57, 23, 10, 4, 1 };

        int32 llen = propertyList.Count();
        for(uint32 gapi = 0; gapi < 6; ++gapi)
        {
            int32 gap = gaps[gapi];

            for(int32 i = gap; i < llen; i++)
            {
                const Js::PropertyRecord* temp = propertyList.Item(i);

                int32 j = 0;
                for(j = i; j >= gap && PropertyNameCmp(propertyList.Item(j - gap), temp); j -= gap)
                {
                    const Js::PropertyRecord* shiftElem = propertyList.Item(j - gap);
                    propertyList.SetItem(j, shiftElem);
                }

                propertyList.SetItem(j, temp);
            }
        }
    }